

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_VERSION_4_3(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_VERSION_4_3 != 0) {
    glad_glClearBufferData = (PFNGLCLEARBUFFERDATAPROC)(*load)("glClearBufferData");
    glad_glClearBufferSubData = (PFNGLCLEARBUFFERSUBDATAPROC)(*load)("glClearBufferSubData");
    glad_glDispatchCompute = (PFNGLDISPATCHCOMPUTEPROC)(*load)("glDispatchCompute");
    glad_glDispatchComputeIndirect =
         (PFNGLDISPATCHCOMPUTEINDIRECTPROC)(*load)("glDispatchComputeIndirect");
    glad_glCopyImageSubData = (PFNGLCOPYIMAGESUBDATAPROC)(*load)("glCopyImageSubData");
    glad_glFramebufferParameteri =
         (PFNGLFRAMEBUFFERPARAMETERIPROC)(*load)("glFramebufferParameteri");
    glad_glGetFramebufferParameteriv =
         (PFNGLGETFRAMEBUFFERPARAMETERIVPROC)(*load)("glGetFramebufferParameteriv");
    glad_glGetInternalformati64v =
         (PFNGLGETINTERNALFORMATI64VPROC)(*load)("glGetInternalformati64v");
    glad_glInvalidateTexSubImage =
         (PFNGLINVALIDATETEXSUBIMAGEPROC)(*load)("glInvalidateTexSubImage");
    glad_glInvalidateTexImage = (PFNGLINVALIDATETEXIMAGEPROC)(*load)("glInvalidateTexImage");
    glad_glInvalidateBufferSubData =
         (PFNGLINVALIDATEBUFFERSUBDATAPROC)(*load)("glInvalidateBufferSubData");
    glad_glInvalidateBufferData = (PFNGLINVALIDATEBUFFERDATAPROC)(*load)("glInvalidateBufferData");
    glad_glInvalidateFramebuffer =
         (PFNGLINVALIDATEFRAMEBUFFERPROC)(*load)("glInvalidateFramebuffer");
    glad_glInvalidateSubFramebuffer =
         (PFNGLINVALIDATESUBFRAMEBUFFERPROC)(*load)("glInvalidateSubFramebuffer");
    glad_glMultiDrawArraysIndirect =
         (PFNGLMULTIDRAWARRAYSINDIRECTPROC)(*load)("glMultiDrawArraysIndirect");
    glad_glMultiDrawElementsIndirect =
         (PFNGLMULTIDRAWELEMENTSINDIRECTPROC)(*load)("glMultiDrawElementsIndirect");
    glad_glGetProgramInterfaceiv =
         (PFNGLGETPROGRAMINTERFACEIVPROC)(*load)("glGetProgramInterfaceiv");
    glad_glGetProgramResourceIndex =
         (PFNGLGETPROGRAMRESOURCEINDEXPROC)(*load)("glGetProgramResourceIndex");
    glad_glGetProgramResourceName =
         (PFNGLGETPROGRAMRESOURCENAMEPROC)(*load)("glGetProgramResourceName");
    glad_glGetProgramResourceiv = (PFNGLGETPROGRAMRESOURCEIVPROC)(*load)("glGetProgramResourceiv");
    glad_glGetProgramResourceLocation =
         (PFNGLGETPROGRAMRESOURCELOCATIONPROC)(*load)("glGetProgramResourceLocation");
    glad_glGetProgramResourceLocationIndex =
         (PFNGLGETPROGRAMRESOURCELOCATIONINDEXPROC)(*load)("glGetProgramResourceLocationIndex");
    glad_glShaderStorageBlockBinding =
         (PFNGLSHADERSTORAGEBLOCKBINDINGPROC)(*load)("glShaderStorageBlockBinding");
    glad_glTexBufferRange = (PFNGLTEXBUFFERRANGEPROC)(*load)("glTexBufferRange");
    glad_glTexStorage2DMultisample =
         (PFNGLTEXSTORAGE2DMULTISAMPLEPROC)(*load)("glTexStorage2DMultisample");
    glad_glTexStorage3DMultisample =
         (PFNGLTEXSTORAGE3DMULTISAMPLEPROC)(*load)("glTexStorage3DMultisample");
    glad_glTextureView = (PFNGLTEXTUREVIEWPROC)(*load)("glTextureView");
    glad_glBindVertexBuffer = (PFNGLBINDVERTEXBUFFERPROC)(*load)("glBindVertexBuffer");
    glad_glVertexAttribFormat = (PFNGLVERTEXATTRIBFORMATPROC)(*load)("glVertexAttribFormat");
    glad_glVertexAttribIFormat = (PFNGLVERTEXATTRIBIFORMATPROC)(*load)("glVertexAttribIFormat");
    glad_glVertexAttribLFormat = (PFNGLVERTEXATTRIBLFORMATPROC)(*load)("glVertexAttribLFormat");
    glad_glVertexAttribBinding = (PFNGLVERTEXATTRIBBINDINGPROC)(*load)("glVertexAttribBinding");
    glad_glVertexBindingDivisor = (PFNGLVERTEXBINDINGDIVISORPROC)(*load)("glVertexBindingDivisor");
    glad_glDebugMessageControl = (PFNGLDEBUGMESSAGECONTROLPROC)(*load)("glDebugMessageControl");
    glad_glDebugMessageInsert = (PFNGLDEBUGMESSAGEINSERTPROC)(*load)("glDebugMessageInsert");
    glad_glDebugMessageCallback = (PFNGLDEBUGMESSAGECALLBACKPROC)(*load)("glDebugMessageCallback");
    glad_glGetDebugMessageLog = (PFNGLGETDEBUGMESSAGELOGPROC)(*load)("glGetDebugMessageLog");
    glad_glPushDebugGroup = (PFNGLPUSHDEBUGGROUPPROC)(*load)("glPushDebugGroup");
    glad_glPopDebugGroup = (PFNGLPOPDEBUGGROUPPROC)(*load)("glPopDebugGroup");
    glad_glObjectLabel = (PFNGLOBJECTLABELPROC)(*load)("glObjectLabel");
    glad_glGetObjectLabel = (PFNGLGETOBJECTLABELPROC)(*load)("glGetObjectLabel");
    glad_glObjectPtrLabel = (PFNGLOBJECTPTRLABELPROC)(*load)("glObjectPtrLabel");
    glad_glGetObjectPtrLabel = (PFNGLGETOBJECTPTRLABELPROC)(*load)("glGetObjectPtrLabel");
    glad_glGetPointerv = (PFNGLGETPOINTERVPROC)(*load)("glGetPointerv");
  }
  return;
}

Assistant:

static void load_GL_VERSION_4_3(GLADloadproc load) {
	if(!GLAD_GL_VERSION_4_3) return;
	glad_glClearBufferData = (PFNGLCLEARBUFFERDATAPROC)load("glClearBufferData");
	glad_glClearBufferSubData = (PFNGLCLEARBUFFERSUBDATAPROC)load("glClearBufferSubData");
	glad_glDispatchCompute = (PFNGLDISPATCHCOMPUTEPROC)load("glDispatchCompute");
	glad_glDispatchComputeIndirect = (PFNGLDISPATCHCOMPUTEINDIRECTPROC)load("glDispatchComputeIndirect");
	glad_glCopyImageSubData = (PFNGLCOPYIMAGESUBDATAPROC)load("glCopyImageSubData");
	glad_glFramebufferParameteri = (PFNGLFRAMEBUFFERPARAMETERIPROC)load("glFramebufferParameteri");
	glad_glGetFramebufferParameteriv = (PFNGLGETFRAMEBUFFERPARAMETERIVPROC)load("glGetFramebufferParameteriv");
	glad_glGetInternalformati64v = (PFNGLGETINTERNALFORMATI64VPROC)load("glGetInternalformati64v");
	glad_glInvalidateTexSubImage = (PFNGLINVALIDATETEXSUBIMAGEPROC)load("glInvalidateTexSubImage");
	glad_glInvalidateTexImage = (PFNGLINVALIDATETEXIMAGEPROC)load("glInvalidateTexImage");
	glad_glInvalidateBufferSubData = (PFNGLINVALIDATEBUFFERSUBDATAPROC)load("glInvalidateBufferSubData");
	glad_glInvalidateBufferData = (PFNGLINVALIDATEBUFFERDATAPROC)load("glInvalidateBufferData");
	glad_glInvalidateFramebuffer = (PFNGLINVALIDATEFRAMEBUFFERPROC)load("glInvalidateFramebuffer");
	glad_glInvalidateSubFramebuffer = (PFNGLINVALIDATESUBFRAMEBUFFERPROC)load("glInvalidateSubFramebuffer");
	glad_glMultiDrawArraysIndirect = (PFNGLMULTIDRAWARRAYSINDIRECTPROC)load("glMultiDrawArraysIndirect");
	glad_glMultiDrawElementsIndirect = (PFNGLMULTIDRAWELEMENTSINDIRECTPROC)load("glMultiDrawElementsIndirect");
	glad_glGetProgramInterfaceiv = (PFNGLGETPROGRAMINTERFACEIVPROC)load("glGetProgramInterfaceiv");
	glad_glGetProgramResourceIndex = (PFNGLGETPROGRAMRESOURCEINDEXPROC)load("glGetProgramResourceIndex");
	glad_glGetProgramResourceName = (PFNGLGETPROGRAMRESOURCENAMEPROC)load("glGetProgramResourceName");
	glad_glGetProgramResourceiv = (PFNGLGETPROGRAMRESOURCEIVPROC)load("glGetProgramResourceiv");
	glad_glGetProgramResourceLocation = (PFNGLGETPROGRAMRESOURCELOCATIONPROC)load("glGetProgramResourceLocation");
	glad_glGetProgramResourceLocationIndex = (PFNGLGETPROGRAMRESOURCELOCATIONINDEXPROC)load("glGetProgramResourceLocationIndex");
	glad_glShaderStorageBlockBinding = (PFNGLSHADERSTORAGEBLOCKBINDINGPROC)load("glShaderStorageBlockBinding");
	glad_glTexBufferRange = (PFNGLTEXBUFFERRANGEPROC)load("glTexBufferRange");
	glad_glTexStorage2DMultisample = (PFNGLTEXSTORAGE2DMULTISAMPLEPROC)load("glTexStorage2DMultisample");
	glad_glTexStorage3DMultisample = (PFNGLTEXSTORAGE3DMULTISAMPLEPROC)load("glTexStorage3DMultisample");
	glad_glTextureView = (PFNGLTEXTUREVIEWPROC)load("glTextureView");
	glad_glBindVertexBuffer = (PFNGLBINDVERTEXBUFFERPROC)load("glBindVertexBuffer");
	glad_glVertexAttribFormat = (PFNGLVERTEXATTRIBFORMATPROC)load("glVertexAttribFormat");
	glad_glVertexAttribIFormat = (PFNGLVERTEXATTRIBIFORMATPROC)load("glVertexAttribIFormat");
	glad_glVertexAttribLFormat = (PFNGLVERTEXATTRIBLFORMATPROC)load("glVertexAttribLFormat");
	glad_glVertexAttribBinding = (PFNGLVERTEXATTRIBBINDINGPROC)load("glVertexAttribBinding");
	glad_glVertexBindingDivisor = (PFNGLVERTEXBINDINGDIVISORPROC)load("glVertexBindingDivisor");
	glad_glDebugMessageControl = (PFNGLDEBUGMESSAGECONTROLPROC)load("glDebugMessageControl");
	glad_glDebugMessageInsert = (PFNGLDEBUGMESSAGEINSERTPROC)load("glDebugMessageInsert");
	glad_glDebugMessageCallback = (PFNGLDEBUGMESSAGECALLBACKPROC)load("glDebugMessageCallback");
	glad_glGetDebugMessageLog = (PFNGLGETDEBUGMESSAGELOGPROC)load("glGetDebugMessageLog");
	glad_glPushDebugGroup = (PFNGLPUSHDEBUGGROUPPROC)load("glPushDebugGroup");
	glad_glPopDebugGroup = (PFNGLPOPDEBUGGROUPPROC)load("glPopDebugGroup");
	glad_glObjectLabel = (PFNGLOBJECTLABELPROC)load("glObjectLabel");
	glad_glGetObjectLabel = (PFNGLGETOBJECTLABELPROC)load("glGetObjectLabel");
	glad_glObjectPtrLabel = (PFNGLOBJECTPTRLABELPROC)load("glObjectPtrLabel");
	glad_glGetObjectPtrLabel = (PFNGLGETOBJECTPTRLABELPROC)load("glGetObjectPtrLabel");
	glad_glGetPointerv = (PFNGLGETPOINTERVPROC)load("glGetPointerv");
}